

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xml_node_struct * pugi::impl::anon_unknown_0::allocate_node(xml_allocator *alloc,xml_node_type type)

{
  xml_node_struct *pxVar1;
  xml_memory_page *page;
  
  pxVar1 = (xml_node_struct *)xml_allocator::allocate_memory(alloc,0x40,&page);
  if (pxVar1 != (xml_node_struct *)0x0) {
    pxVar1->first_child = (xml_node_struct *)0x0;
    pxVar1->prev_sibling_c = (xml_node_struct *)0x0;
    pxVar1->next_sibling = (xml_node_struct *)0x0;
    pxVar1->first_attribute = (xml_attribute_struct *)0x0;
    pxVar1->name = (char_t *)0x0;
    pxVar1->value = (char_t *)0x0;
    pxVar1->parent = (xml_node_struct *)0x0;
    pxVar1->first_child = (xml_node_struct *)0x0;
    pxVar1->header = (ulong)type | ((long)pxVar1 - (long)page) * 0x100;
  }
  return pxVar1;
}

Assistant:

inline xml_node_struct* allocate_node(xml_allocator& alloc, xml_node_type type)
	{
		xml_memory_page* page;
		void* memory = alloc.allocate_object(sizeof(xml_node_struct), page);
		if (!memory) return 0;

		return new (memory) xml_node_struct(page, type);
	}